

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::auto_fwd_release_rpc_cli
          (raft_server *this,ptr<auto_fwd_pkg> *cur_pkg,ptr<rpc_client> *rpc_cli)

{
  return_method_type rVar1;
  _List_node_base *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  int iVar5;
  unique_lock<std::mutex> ll;
  unique_lock<std::mutex> l;
  ptr<raft_params> params;
  anon_class_32_4_602b9eac put_back_to_idle_list;
  auto_fwd_req_resp entry;
  raft_server *local_a8;
  rpc_handler handler;
  _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  local_80;
  code *local_38;
  undefined8 local_30;
  
  context::get_params((context *)&params);
  rVar1 = (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          return_method_;
  put_back_to_idle_list.max_conns = 1;
  if (1 < (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          auto_forwarding_max_connections_) {
    put_back_to_idle_list.max_conns =
         (size_t)(uint)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->auto_forwarding_max_connections_;
  }
  put_back_to_idle_list.cur_pkg = cur_pkg;
  put_back_to_idle_list.rpc_cli = rpc_cli;
  put_back_to_idle_list.this = this;
  std::unique_lock<std::mutex>::unique_lock
            (&l,&((cur_pkg->
                  super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr)->lock_);
  if (rVar1 == blocking) {
    auto_fwd_release_rpc_cli::anon_class_32_4_602b9eac::operator()(&put_back_to_idle_list);
    EventAwaiter::invoke
              (&((cur_pkg->
                 super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->ea_);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock(&ll,&this->auto_fwd_reqs_lock_);
    p_Var2 = (this->auto_fwd_reqs_).
             super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->auto_fwd_reqs_) {
      std::unique_lock<std::mutex>::unlock(&ll);
      auto_fwd_release_rpc_cli::anon_class_32_4_602b9eac::operator()(&put_back_to_idle_list);
    }
    else {
      auto_fwd_req_resp::auto_fwd_req_resp(&entry,(auto_fwd_req_resp *)(p_Var2 + 1));
      std::__cxx11::
      list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
      ::pop_front(&this->auto_fwd_reqs_);
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 != (element_type *)0x0) {
        iVar5 = (*peVar3->_vptr_logger[7])();
        if (5 < iVar5) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&local_80,"found waiting request in the queue, remaining elems %zu",
                     (this->auto_fwd_reqs_).
                     super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                     ._M_impl._M_node._M_size);
          (*peVar3->_vptr_logger[8])
                    (peVar3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"auto_fwd_release_rpc_cli",0x137,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
        }
      }
      std::unique_lock<std::mutex>::unlock(&ll);
      local_38 = auto_fwd_resp_handler;
      local_30 = 0;
      local_a8 = this;
      std::
      _Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
      ::
      _Bind<nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>&,std::shared_ptr<nuraft::rpc_client>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
                  *)&local_80,(offset_in_raft_server_to_subr *)&local_38,&local_a8,&entry.resp,
                 cur_pkg,rpc_cli,(_Placeholder<1> *)&std::placeholders::_1,
                 (_Placeholder<2> *)&std::placeholders::_2);
      std::
      function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
                ((function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
                  *)&handler,&local_80);
      std::
      _Tuple_impl<1UL,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      ::~_Tuple_impl((_Tuple_impl<1UL,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                      *)&local_80._M_bound_args);
      std::unique_lock<std::mutex>::unlock(&l);
      peVar4 = (rpc_cli->super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar4->_vptr_rpc_client[2])
                (peVar4,&entry,&handler,
                 (long)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->auto_forwarding_req_timeout_);
      std::_Function_base::~_Function_base(&handler.super__Function_base);
      auto_fwd_req_resp::~auto_fwd_req_resp(&entry);
    }
    std::unique_lock<std::mutex>::~unique_lock(&ll);
  }
  std::unique_lock<std::mutex>::~unique_lock(&l);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void raft_server::auto_fwd_release_rpc_cli( ptr<auto_fwd_pkg> cur_pkg,
                                            ptr<rpc_client> rpc_cli )
{
    ptr<raft_params> params = ctx_->get_params();
    size_t max_conns =
        std::max(1, params->auto_forwarding_max_connections_);
    bool is_blocking_mode = (params->return_method_ == raft_params::blocking);

    auto put_back_to_idle_list = [&cur_pkg, &rpc_cli, max_conns, this]() {
        cur_pkg->rpc_client_in_use_.erase(rpc_cli);
        cur_pkg->rpc_client_idle_.push_front(rpc_cli);
        p_tr( "release connection %p, idle %zu, in-use %zu, max %zu",
              rpc_cli.get(),
              cur_pkg->rpc_client_idle_.size(),
              cur_pkg->rpc_client_in_use_.size(),
              max_conns );
    };

    std::unique_lock<std::mutex> l(cur_pkg->lock_);
    if (is_blocking_mode) {
        // Blocking mode, put the connection back to idle list,
        // and wake up the sleeping thread.
        put_back_to_idle_list();
        cur_pkg->ea_.invoke();

    } else {
        // Async mode, send the request in the queue.
        std::unique_lock<std::mutex> ll(auto_fwd_reqs_lock_);
        if (!auto_fwd_reqs_.empty()) {
            auto_fwd_req_resp entry = *auto_fwd_reqs_.begin();
            auto_fwd_reqs_.pop_front();
            p_tr( "found waiting request in the queue, remaining elems %zu",
                  auto_fwd_reqs_.size() );
            ll.unlock();

            rpc_handler handler = std::bind( &raft_server::auto_fwd_resp_handler,
                                             this,
                                             entry.resp,
                                             cur_pkg,
                                             rpc_cli,
                                             std::placeholders::_1,
                                             std::placeholders::_2 );

            // Should be unlocked before calling `send`, as resp handler can be
            // invoked in the same thread in case of error.
            l.unlock();
            rpc_cli->send(entry.req, handler, params->auto_forwarding_req_timeout_);

        } else {
            // If no request is waiting, put the connection back to idle list.
            ll.unlock();
            put_back_to_idle_list();
        }
    }
}